

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O0

void __thiscall
mjs::gc_vector<mjs::object::property>::erase(gc_vector<mjs::object::property> *this,property *elem)

{
  property *ppVar1;
  bool bVar2;
  property *elem_local;
  gc_vector<mjs::object::property> *this_local;
  
  ppVar1 = begin(this);
  bVar2 = false;
  if (ppVar1 <= elem) {
    ppVar1 = end(this);
    bVar2 = elem < ppVar1;
  }
  if (!bVar2) {
    __assert_fail("elem >= begin() && elem < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                  ,0x3a,
                  "void mjs::gc_vector<mjs::object::property>::erase(T *) [T = mjs::object::property]"
                 );
  }
  ppVar1 = begin(this);
  erase(this,(uint32_t)((long)elem - (long)ppVar1 >> 4));
  return;
}

Assistant:

void erase(T* elem) {
        assert(elem >= begin() && elem < end());
        erase(static_cast<uint32_t>(elem - begin()));
    }